

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicFile.cpp
# Opt level: O0

int __thiscall AtomicFile::impl::truncate(impl *this,char *__file,__off_t __length)

{
  impl *this_local;
  
  File::truncate(&this->temp_file,__file,__length);
  this->is_temp_active = true;
  return (int)this;
}

Assistant:

void AtomicFile::impl::truncate ()
{
  try 
  {
    temp_file.truncate ();
    is_temp_active = true;
  }
  catch (...)
  {
    allow_atomics = false;
    throw;
  }
}